

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Http.cpp
# Opt level: O0

void __thiscall asl::HttpMessage::readHeaders(HttpMessage *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  String local_e8;
  String local_d0;
  undefined4 local_b8;
  int local_b4;
  int i;
  String local_98;
  String local_80;
  undefined1 local_68 [8];
  String line;
  undefined1 local_40 [8];
  String headerValue;
  String headerName;
  HttpMessage *this_local;
  
  asl::String::String((String *)((long)&headerValue.field_2 + 8));
  asl::String::String((String *)local_40);
  asl::String::String((String *)local_68);
LAB_0014294b:
  do {
    Socket::readLine(&local_80,this->_socket);
    asl::String::operator=((String *)local_68,&local_80);
    bVar1 = asl::String::operator!=((String *)local_68,"\r");
    asl::String::~String(&local_80);
    if (!bVar1) {
      local_b8 = 0;
LAB_00142c16:
      asl::String::~String((String *)local_68);
      asl::String::~String((String *)local_40);
      asl::String::~String((String *)((long)&headerValue.field_2 + 8));
      return;
    }
    pcVar4 = asl::String::operator[]((String *)local_68,0);
    iVar2 = isspace((int)*pcVar4);
    if (iVar2 != 0) {
      asl::String::trimmed((String *)&stack0xffffffffffffff50,(String *)local_68);
      asl::String::operator+(&local_98,(String *)local_40,(String *)&stack0xffffffffffffff50);
      setHeader(this,(String *)((long)&headerValue.field_2 + 8),&local_98);
      asl::String::~String(&local_98);
      asl::String::~String((String *)&stack0xffffffffffffff50);
      goto LAB_0014294b;
    }
    asl::String::trim((String *)local_68);
    iVar2 = 0x3a;
    local_b4 = asl::String::indexOf((String *)local_68,':',0);
    if (local_b4 < 0) {
      Socket::close(this->_socket,iVar2);
      local_b8 = 1;
      goto LAB_00142c16;
    }
    asl::String::substring(&local_d0,(String *)local_68,0,local_b4);
    asl::String::operator=((String *)((long)&headerValue.field_2 + 8),&local_d0);
    asl::String::~String(&local_d0);
    iVar2 = local_b4;
    iVar3 = asl::String::length((String *)local_68);
    if (iVar2 < iVar3 + -1) {
      asl::String::substring(&local_e8,(String *)local_68,local_b4 + 2);
    }
    else {
      asl::String::String(&local_e8);
    }
    asl::String::operator=((String *)local_40,&local_e8);
    asl::String::~String(&local_e8);
    setHeader(this,(String *)((long)&headerValue.field_2 + 8),(String *)local_40);
  } while( true );
}

Assistant:

void HttpMessage::readHeaders()
{
	String headerName, headerValue, line;

	while (line = _socket->readLine(), line != "\r")
	{
		if (isspace(line[0])) // multiline
		{
			setHeader(headerName, headerValue + line.trimmed());
			continue;
		}
		line.trim();
		int i = line.indexOf(':');
		if (i<0) {
			_socket->close();
			return;
		}
		headerName = line.substring(0, i);
		headerValue = (i < line.length() - 1) ? line.substring(i + 2) : String();
		setHeader(headerName, headerValue);
	}
}